

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsValidation.cpp
# Opt level: O1

bool chrono::utils::Validate
               (Data *sim_data,Data *ref_data,ChNormType norm_type,double tolerance,
               DataVector *norms)

{
  size_t sVar1;
  bool bVar2;
  double *pdVar3;
  size_t sVar4;
  double *__src;
  ChValidation validator;
  ChValidation local_c8;
  
  local_c8.m_INF_norms._M_size = 0;
  local_c8.m_INF_norms._M_data = (double *)0x0;
  local_c8.m_sim_data.
  super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.m_ref_data.
  super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.m_ref_data.
  super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.m_ref_data.
  super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.m_L2_norms._M_size = 0;
  local_c8.m_L2_norms._M_data = (double *)0x0;
  local_c8.m_RMS_norms._M_size = 0;
  local_c8.m_RMS_norms._M_data = (double *)0x0;
  local_c8.m_sim_headers.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.m_sim_headers.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.m_sim_headers.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.m_ref_headers.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.m_ref_headers.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.m_ref_headers.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.m_sim_data.
  super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.m_sim_data.
  super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar2 = ChValidation::Process(&local_c8,sim_data,ref_data);
  if (!bVar2) {
LAB_00950053:
    bVar2 = false;
    goto LAB_00950055;
  }
  sVar1 = local_c8.m_num_cols - 1;
  if (norms->_M_size != sVar1) {
    operator_delete(norms->_M_data);
    norms->_M_size = sVar1;
    pdVar3 = (double *)::operator_new(sVar1 * 8);
    norms->_M_data = pdVar3;
  }
  pdVar3 = norms->_M_data;
  if (sVar1 != 0) {
    memset(pdVar3,0,local_c8.m_num_cols * 8 - 8);
  }
  if (norm_type == L2_NORM) {
    sVar4 = norms->_M_size;
    if (sVar4 == local_c8.m_L2_norms._M_size) {
      __src = local_c8.m_L2_norms._M_data;
      if (sVar4 == 0) goto LAB_0095002c;
    }
    else {
      if (pdVar3 != (double *)0x0) {
        operator_delete(pdVar3);
      }
      norms->_M_size = local_c8.m_L2_norms._M_size;
      pdVar3 = (double *)::operator_new(local_c8.m_L2_norms._M_size << 3);
      norms->_M_data = pdVar3;
      __src = local_c8.m_L2_norms._M_data;
LAB_0095000c:
      if (__src == (double *)0x0) goto LAB_0095002c;
      sVar4 = norms->_M_size;
    }
LAB_00950021:
    memcpy(pdVar3,__src,sVar4 << 3);
  }
  else {
    if (norm_type == RMS_NORM) {
      sVar4 = norms->_M_size;
      __src = local_c8.m_RMS_norms._M_data;
      if (sVar4 != local_c8.m_RMS_norms._M_size) {
        if (pdVar3 != (double *)0x0) {
          operator_delete(pdVar3);
        }
        norms->_M_size = local_c8.m_RMS_norms._M_size;
        pdVar3 = (double *)::operator_new(local_c8.m_RMS_norms._M_size << 3);
        norms->_M_data = pdVar3;
        __src = local_c8.m_RMS_norms._M_data;
        goto LAB_0095000c;
      }
    }
    else {
      if (norm_type != INF_NORM) goto LAB_0095002c;
      sVar4 = norms->_M_size;
      __src = local_c8.m_INF_norms._M_data;
      if (sVar4 != local_c8.m_INF_norms._M_size) {
        if (pdVar3 != (double *)0x0) {
          operator_delete(pdVar3);
        }
        norms->_M_size = local_c8.m_INF_norms._M_size;
        pdVar3 = (double *)::operator_new(local_c8.m_INF_norms._M_size << 3);
        norms->_M_data = pdVar3;
        __src = local_c8.m_INF_norms._M_data;
        goto LAB_0095000c;
      }
    }
    if (sVar4 != 0) goto LAB_00950021;
  }
LAB_0095002c:
  bVar2 = sVar1 == 0;
  if (!bVar2) {
    sVar4 = 0;
    do {
      if (tolerance < norms->_M_data[sVar4]) goto LAB_00950053;
      sVar4 = sVar4 + 1;
    } while (sVar1 != sVar4);
    bVar2 = true;
  }
LAB_00950055:
  ChValidation::~ChValidation(&local_c8);
  return bVar2;
}

Assistant:

ChApi bool Validate(const Data& sim_data,
                    const Data& ref_data,
                    ChNormType norm_type,
                    double tolerance,
                    DataVector& norms) {
    ChValidation validator;

    if (!validator.Process(sim_data, ref_data))
        return false;

    size_t num_cols = validator.GetNumColumns() - 1;
    norms.resize(num_cols);

    switch (norm_type) {
        case L2_NORM:
            norms = validator.GetL2norms();
            break;
        case RMS_NORM:
            norms = validator.GetRMSnorms();
            break;
        case INF_NORM:
            norms = validator.GetINFnorms();
            break;
    }

    for (size_t col = 0; col < num_cols; col++) {
        if (norms[col] > tolerance)
            return false;
    }

    return true;
}